

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

void __thiscall QAccessibleWidget::addControllingSignal(QAccessibleWidget *this,QString *signal)

{
  QAccessibleWidgetPrivate *pQVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_68;
  char *local_50;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLatin1_helper((QString *)&local_68);
  QMetaObject::normalizedSignature((char *)&local_48);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  puVar3 = (undefined8 *)(**(code **)(*(long *)this + 0x18))(this);
  pcVar4 = (char *)(**(code **)*puVar3)(puVar3);
  iVar2 = QMetaObject::indexOfSignal(pcVar4);
  if (iVar2 < 0) {
    local_68.d._0_4_ = 2;
    local_68.d._4_4_ = 0;
    local_68.ptr._0_4_ = 0;
    local_68.ptr._4_4_ = 0;
    local_68.size._0_4_ = 0;
    local_68.size._4_4_ = 0;
    local_50 = "default";
    pcVar4 = local_48.ptr;
    if (local_48.ptr == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    puVar3 = (undefined8 *)(**(code **)(*(long *)this + 0x18))(this);
    (**(code **)*puVar3)(puVar3);
    uVar5 = QMetaObject::className();
    QMessageLogger::warning((char *)&local_68,"Signal %s unknown in %s",pcVar4,uVar5);
  }
  pQVar1 = this->d;
  latin1.m_data = local_48.ptr;
  latin1.m_size = local_48.size;
  QString::QString((QString *)&local_68,latin1);
  QList<QString>::emplaceBack<QString>(&pQVar1->primarySignals,(QString *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleWidget::addControllingSignal(const QString &signal)
{
    QByteArray s = QMetaObject::normalizedSignature(signal.toLatin1());
    if (Q_UNLIKELY(object()->metaObject()->indexOfSignal(s) < 0))
        qWarning("Signal %s unknown in %s", s.constData(), object()->metaObject()->className());
    d->primarySignals << QLatin1StringView(s);
}